

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_function_set.cpp
# Opt level: O1

void __thiscall
duckdb::MapCastInfo::AddEntry
          (MapCastInfo *this,LogicalType *source,LogicalType *target,MapCastNode *node)

{
  _Map_base<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  _Map_base<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeIdEquality,_duckdb::LogicalTypeIdHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_01;
  _Hashtable<duckdb::LogicalType,std::pair<duckdb::LogicalType_const,duckdb::MapCastNode>,std::allocator<std::pair<duckdb::LogicalType_const,duckdb::MapCastNode>>,std::__detail::_Select1st,duckdb::LogicalTypeEquality,duckdb::LogicalTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var1;
  LogicalTypeId local_62;
  LogicalTypeId local_61;
  LogicalType local_60;
  cast_function_t local_48;
  init_cast_local_state_t p_Stack_40;
  BoundCastData *local_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  local_61 = source->id_;
  this_00 = (_Map_base<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             *)::std::__detail::_Map_base<$5c4d8eca$>::operator[]
                         ((_Map_base<_5c4d8eca_> *)&this->casts,&local_61);
  this_01 = (_Map_base<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeIdEquality,_duckdb::LogicalTypeIdHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             *)::std::__detail::
               _Map_base<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[](this_00,source);
  local_62 = target->id_;
  p_Var1 = (_Hashtable<duckdb::LogicalType,std::pair<duckdb::LogicalType_const,duckdb::MapCastNode>,std::allocator<std::pair<duckdb::LogicalType_const,duckdb::MapCastNode>>,std::__detail::_Select1st,duckdb::LogicalTypeEquality,duckdb::LogicalTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            *)::std::__detail::
              _Map_base<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeIdEquality,_duckdb::LogicalTypeIdHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[](this_01,&local_62);
  LogicalType::LogicalType(&local_60,target);
  local_48 = (node->cast_info).function;
  p_Stack_40 = (node->cast_info).init_local_state;
  local_38 = (node->cast_info).cast_data.
             super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
             .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
  (node->cast_info).cast_data.
  super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
  super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl = (BoundCastData *)0x0;
  local_30 = *(undefined4 *)&node->bind_function;
  uStack_2c = *(undefined4 *)((long)&node->bind_function + 4);
  uStack_28 = (undefined4)node->implicit_cast_cost;
  uStack_24 = *(undefined4 *)((long)&node->implicit_cast_cost + 4);
  ::std::
  _Hashtable<duckdb::LogicalType,std::pair<duckdb::LogicalType_const,duckdb::MapCastNode>,std::allocator<std::pair<duckdb::LogicalType_const,duckdb::MapCastNode>>,std::__detail::_Select1st,duckdb::LogicalTypeEquality,duckdb::LogicalTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<duckdb::LogicalType,duckdb::MapCastNode>>(p_Var1,&local_60);
  if (local_38 != (BoundCastData *)0x0) {
    (*local_38->_vptr_BoundCastData[1])();
  }
  local_38 = (BoundCastData *)0x0;
  LogicalType::~LogicalType(&local_60);
  return;
}

Assistant:

void AddEntry(const LogicalType &source, const LogicalType &target, MapCastNode node) {
		casts[source.id()][source][target.id()].insert(make_pair(target, std::move(node)));
	}